

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_randomnumberutil.cpp
# Opt level: O0

void __thiscall
RandomNumberUtil_GetRandomBytes16_Test::TestBody(RandomNumberUtil_GetRandomBytes16_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *s2;
  AssertHelper local_148;
  Message local_140;
  ByteData local_138;
  string local_120;
  ByteData local_100;
  string local_e8;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  unsigned_long local_a8;
  size_type local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80;
  unsigned_long local_78;
  size_type local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  int size;
  RandomNumberUtil_GetRandomBytes16_Test *this_local;
  
  cfd::core::RandomNumberUtil::GetRandomBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0x10);
  cfd::core::RandomNumberUtil::GetRandomBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0x10);
  local_70 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_78 = 0x10;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_68,"bytes.size()","static_cast<size_t>(size)",&local_70,
             &local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_a0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  local_a8 = 0x10;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"bytes2.size()","static_cast<size_t>(size)",&local_a0,
             &local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x27,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  cfd::core::ByteData::ByteData
            (&local_100,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_e8,&local_100);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::ByteData
            (&local_138,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_120,&local_138);
  s2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTRNE
            ((internal *)local_c8,"ByteData(bytes).GetHex().c_str()",
             "ByteData(bytes2).GetHex().c_str()",pcVar2,s2);
  std::__cxx11::string::~string((string *)&local_120);
  cfd::core::ByteData::~ByteData(&local_138);
  std::__cxx11::string::~string((string *)&local_e8);
  cfd::core::ByteData::~ByteData(&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(RandomNumberUtil, GetRandomBytes16) {
  int size = 16;
  std::vector<uint8_t> bytes = RandomNumberUtil::GetRandomBytes(size);
  std::vector<uint8_t> bytes2 = RandomNumberUtil::GetRandomBytes(size);
  EXPECT_EQ(bytes.size(), static_cast<size_t>(size));
  EXPECT_EQ(bytes2.size(), static_cast<size_t>(size));
  EXPECT_STRNE(ByteData(bytes).GetHex().c_str(),
               ByteData(bytes2).GetHex().c_str());
}